

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getWorldBaseTransform
          (KinDynComputations *this,MatrixView<double> *world_T_base)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined1 *puVar4;
  long lVar5;
  pointer peVar6;
  Index row;
  long lVar7;
  pointer peVar8;
  Index col;
  long lVar9;
  bool bVar10;
  undefined1 local_90 [128];
  
  if ((world_T_base->m_rows == 4) && (world_T_base->m_cols == 4)) {
    iDynTree::FreeFloatingPos::worldBasePos();
    puVar4 = local_90;
    iDynTree::Transform::asHomogeneousTransform();
    bVar10 = world_T_base->m_storageOrder == ColumnMajor;
    lVar1 = world_T_base->m_cols;
    lVar2 = world_T_base->m_rows;
    lVar3 = 1;
    if (bVar10) {
      lVar3 = lVar2;
    }
    lVar5 = 1;
    if (!bVar10) {
      lVar5 = lVar1;
    }
    if (0 < lVar2) {
      peVar6 = world_T_base->m_storage;
      lVar7 = 0;
      do {
        if (0 < lVar1) {
          lVar9 = 0;
          peVar8 = peVar6;
          do {
            *peVar8 = *(element_type *)(puVar4 + lVar9 * 8);
            lVar9 = lVar9 + 1;
            peVar8 = peVar8 + lVar3;
          } while (lVar1 != lVar9);
        }
        lVar7 = lVar7 + 1;
        puVar4 = puVar4 + 0x20;
        peVar6 = peVar6 + lVar5;
      } while (lVar7 != lVar2);
    }
    bVar10 = true;
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getWorldBaseTransform","Wrong size in input world_T_base");
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool KinDynComputations::getWorldBaseTransform(iDynTree::MatrixView<double> world_T_base) const
{
    constexpr int expected_transform_cols = 4;
    constexpr int expected_transform_rows = 4;
    bool ok = (world_T_base.rows() == expected_transform_rows) && (world_T_base.cols() == expected_transform_cols);
    if( !ok )
    {
        reportError("KinDynComputations","getWorldBaseTransform","Wrong size in input world_T_base");
        return false;
    }

    toEigen(world_T_base) = toEigen(this->pimpl->m_pos.worldBasePos().asHomogeneousTransform());

    return true;
}